

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBarrelShape.cpp
# Opt level: O2

void __thiscall chrono::ChBarrelShape::ArchiveIN(ChBarrelShape *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChBarrelShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30._value = &this->Hlow;
  local_30._name = "Hlow";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->Hsup;
  local_48._name = "Hsup";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->Rvert;
  local_60._name = "Rvert";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->Rhor;
  local_78._name = "Rhor";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->Roffset;
  local_90._name = "Roffset";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  return;
}

Assistant:

void ChBarrelShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBarrelShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(Hlow);
	marchive >> CHNVP(Hsup);
	marchive >> CHNVP(Rvert);
	marchive >> CHNVP(Rhor);
	marchive >> CHNVP(Roffset);
}